

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeSizeof(ExpressionContext *ctx,SynSizeof *syntax)

{
  TypeBase *pTVar1;
  longlong lVar2;
  _func_int **pp_Var3;
  int iVar4;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  ExprBase *initializer;
  ExprBase *pEVar7;
  char *msg;
  int iVar8;
  TypeBase *pTVar6;
  undefined4 extraout_var_00;
  
  pTVar5 = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
  pTVar6 = pTVar5;
  if (pTVar5 == (TypeBase *)0x0) {
LAB_00186b8e:
    if (pTVar5 != (TypeBase *)0x0) {
      return (ExprBase *)pTVar6;
    }
    initializer = AnalyzeExpression(ctx,syntax->value);
    if (initializer->type != ctx->typeAuto) {
      pTVar6 = initializer->type;
      if ((pTVar6 == (TypeBase *)0x0) || (pTVar5 = pTVar6, pTVar6->typeID != 0x18)) {
        pTVar5 = (TypeBase *)0x0;
      }
      if ((pTVar5 == (TypeBase *)0x0) || (*(char *)&pTVar5[3]._vptr_TypeBase != '\0')) {
        ResolveInitializerValue(ctx,&syntax->super_SynBase,initializer);
        pTVar6 = initializer->type;
        if ((pTVar6 != (TypeBase *)0x0) &&
           ((pTVar6->typeID == 0x1b ||
            ((pTVar6 != (TypeBase *)0x0 &&
             ((pTVar6->typeID == 0x1c || ((pTVar6 != (TypeBase *)0x0 && (pTVar6->typeID == 0x1a)))))
             ))))) {
          __assert_fail("!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2e35,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
        pTVar6 = ctx->typeInt;
        pp_Var3 = (_func_int **)initializer->type->size;
        pEVar7->typeID = 6;
        pEVar7->source = &syntax->super_SynBase;
        pEVar7->type = pTVar6;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar7[1]._vptr_ExprBase = pp_Var3;
        return pEVar7;
      }
      iVar4 = *(int *)&(pTVar6->name).end;
      iVar8 = (int)(pTVar6->name).begin;
LAB_00186cd8:
      anon_unknown.dwarf_c6b42::Stop
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                 (ulong)(uint)(iVar4 - iVar8));
    }
  }
  else {
    if (pTVar5->isGeneric == true) {
      msg = "ERROR: sizeof generic type is illegal";
      goto LAB_00186c9b;
    }
    if (pTVar5 != ctx->typeAuto) {
      if ((pTVar5->typeID == 0x18) && (*(char *)&pTVar5[3]._vptr_TypeBase == '\0')) {
        iVar4 = *(int *)&(pTVar5->name).end;
        iVar8 = (int)(pTVar5->name).begin;
        goto LAB_00186cd8;
      }
      if (((pTVar5->typeID == 0x1b) || (pTVar5->typeID == 0x1c)) || (pTVar5->typeID == 0x1a)) {
        __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2e23,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar6 = (TypeBase *)CONCAT44(extraout_var,iVar4);
      pTVar1 = ctx->typeInt;
      lVar2 = pTVar5->size;
      pTVar6->typeID = 6;
      (pTVar6->name).begin = (char *)syntax;
      (pTVar6->name).end = (char *)pTVar1;
      pTVar6->importModule = (ModuleData *)0x0;
      *(undefined1 *)&pTVar6->typeIndex = 0;
      pTVar6->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248500;
      pTVar6->size = lVar2;
      goto LAB_00186b8e;
    }
  }
  msg = "ERROR: sizeof auto type is illegal";
LAB_00186c9b:
  anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBase* AnalyzeSizeof(ExpressionContext &ctx, SynSizeof *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(type->isGeneric)
			Stop(ctx, syntax, "ERROR: sizeof generic type is illegal");

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
		}

		assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, type->size);
	}

	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(value->type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

	if(TypeClass *typeClass = getType<TypeClass>(value->type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(value->type->name));
	}

	ResolveInitializerValue(ctx, syntax, value);

	assert(!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type));

	return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, value->type->size);
}